

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O1

void * plot_new(t_symbol *classsym,int argc,t_atom *argv)

{
  t_atom *ptVar1;
  t_float tVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  t_pd *object;
  _glist *p_Var5;
  t_symbol *ptVar6;
  t_pd *pp_Var7;
  _fielddesc *fd;
  int iVar8;
  int local_9c;
  
  object = pd_new(plot_class);
  p_Var5 = canvas_getcurrent();
  object[6] = (t_pd)p_Var5;
  ptVar6 = gensym("x");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2a),ptVar6);
  ptVar6 = gensym("y");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2f),ptVar6);
  ptVar6 = gensym("w");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x34),ptVar6);
  *(undefined2 *)(object + 0x39) = 1;
  *(undefined4 *)(object + 0x3a) = 0x3f800000;
  object[0x3b] = (t_pd)0x0;
  object[0x3c] = (t_pd)0x0;
  *(undefined4 *)(object + 0x3d) = 0;
  *(undefined2 *)(object + 0x3e) = 1;
  *(undefined4 *)(object + 0x3f) = 0x3f800000;
  object[0x40] = (t_pd)0x0;
  object[0x41] = (t_pd)0x0;
  *(undefined4 *)(object + 0x42) = 0;
  *(undefined2 *)(object + 0x43) = 1;
  *(undefined4 *)(object + 0x44) = 0x3f800000;
  object[0x45] = (t_pd)0x0;
  object[0x46] = (t_pd)0x0;
  *(undefined4 *)(object + 0x47) = 0;
  local_9c = 1;
  do {
    ptVar6 = atom_getsymbolarg(0,argc,argv);
    __s1 = ptVar6->s_name;
    iVar4 = strcmp(__s1,"curve");
    if (iVar4 == 0) {
LAB_0015e059:
      argc = argc + -1;
      argv = argv + 1;
      bVar3 = true;
      local_9c = 2;
    }
    else {
      iVar4 = strcmp(__s1,"-c");
      if (iVar4 == 0) goto LAB_0015e059;
      iVar4 = strcmp(__s1,"-v");
      if ((argc < 2) || (iVar4 != 0)) {
        iVar4 = strcmp(__s1,"-vs");
        if ((1 < argc) && (iVar4 == 0)) {
          if (argv[1].a_type != A_SYMBOL) {
            tVar2 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x3e) = 1;
            *(t_float *)(object + 0x3f) = tVar2;
            pp_Var7 = object + 0x40;
            goto LAB_0015e268;
          }
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x3e);
LAB_0015e1cd:
          fielddesc_setfloat_var(fd,ptVar6);
          goto LAB_0015e272;
        }
        iVar4 = strcmp(__s1,"-x");
        if ((1 < argc) && (iVar4 == 0)) {
          if (argv[1].a_type != A_SYMBOL) {
            tVar2 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x2a) = 1;
            *(t_float *)(object + 0x2b) = tVar2;
            pp_Var7 = object + 0x2c;
            goto LAB_0015e268;
          }
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x2a);
          goto LAB_0015e1cd;
        }
        iVar4 = strcmp(__s1,"-y");
        if ((1 < argc) && (iVar4 == 0)) {
          if (argv[1].a_type != A_SYMBOL) {
            tVar2 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x2f) = 1;
            *(t_float *)(object + 0x30) = tVar2;
            pp_Var7 = object + 0x31;
            goto LAB_0015e268;
          }
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x2f);
          goto LAB_0015e1cd;
        }
        iVar4 = strcmp(__s1,"-w");
        if ((1 < argc) && (iVar4 == 0)) {
          if (argv[1].a_type != A_SYMBOL) {
            tVar2 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x34) = 1;
            *(t_float *)(object + 0x35) = tVar2;
            pp_Var7 = object + 0x36;
            goto LAB_0015e268;
          }
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x34);
          goto LAB_0015e1cd;
        }
        iVar4 = strcmp(__s1,"-e");
        if ((1 < argc) && (iVar4 == 0)) {
          if (argv[1].a_type != A_SYMBOL) {
            tVar2 = argv[1].a_w.w_float;
            *(undefined2 *)(object + 0x43) = 1;
            *(t_float *)(object + 0x44) = tVar2;
            pp_Var7 = object + 0x45;
            goto LAB_0015e268;
          }
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x43);
          goto LAB_0015e1cd;
        }
        if (*__s1 == '-') {
          pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,__s1);
          argc = argc + -1;
          argv = argv + 1;
          goto LAB_0015e27a;
        }
        bVar3 = false;
      }
      else {
        if (argv[1].a_type == A_SYMBOL) {
          ptVar6 = argv[1].a_w.w_symbol;
          fd = (_fielddesc *)(object + 0x39);
          goto LAB_0015e1cd;
        }
        tVar2 = argv[1].a_w.w_float;
        *(undefined2 *)(object + 0x39) = 1;
        *(t_float *)(object + 0x3a) = tVar2;
        pp_Var7 = object + 0x3b;
LAB_0015e268:
        *pp_Var7 = (t_pd)0x0;
        pp_Var7[1] = (t_pd)0x0;
        *(undefined4 *)(pp_Var7 + 2) = 0;
LAB_0015e272:
        argc = argc + -2;
        argv = argv + 2;
LAB_0015e27a:
        bVar3 = true;
      }
    }
    if (!bVar3) {
      if (argc == 0) {
        *(undefined2 *)(object + 0x25) = 1;
        *(undefined4 *)(object + 0x26) = 0x3f800000;
        object[0x27] = (t_pd)0x0;
        object[0x28] = (t_pd)0x0;
        *(undefined4 *)(object + 0x29) = 0;
        iVar4 = 0;
      }
      else {
        iVar4 = argc + -1;
        ptVar1 = argv + 1;
        if (argc < 1) {
          *(undefined2 *)(object + 0x25) = 1;
          *(undefined4 *)(object + 0x26) = 0;
          object[0x27] = (t_pd)0x0;
          object[0x28] = (t_pd)0x0;
          *(undefined4 *)(object + 0x29) = 0;
          argv = ptVar1;
        }
        else if (argv->a_type == A_SYMBOL) {
          *(undefined2 *)(object + 0x25) = 0x137;
          *(word *)(object + 0x26) = argv->a_w;
          argv = ptVar1;
        }
        else {
          tVar2 = (argv->a_w).w_float;
          *(undefined2 *)(object + 0x25) = 1;
          *(t_float *)(object + 0x26) = tVar2;
          object[0x27] = (t_pd)0x0;
          object[0x28] = (t_pd)0x0;
          *(undefined4 *)(object + 0x29) = 0;
          argv = ptVar1;
        }
      }
      if (iVar4 == 0) {
        *(undefined2 *)(object + 7) = 1;
        iVar8 = 0;
        *(undefined4 *)(object + 8) = 0;
        object[9] = (t_pd)0x0;
        object[10] = (t_pd)0x0;
        *(undefined4 *)(object + 0xb) = 0;
      }
      else {
        iVar8 = iVar4 + -1;
        fielddesc_setfloatarg((_fielddesc *)(object + 7),iVar4,argv);
        argv = argv + 1;
      }
      if (iVar8 == 0) {
        *(undefined2 *)(object + 0xc) = 1;
        *(undefined4 *)(object + 0xd) = 0x3f800000;
        object[0xe] = (t_pd)0x0;
        object[0xf] = (t_pd)0x0;
        *(undefined4 *)(object + 0x10) = 0;
        iVar4 = 0;
      }
      else {
        iVar4 = iVar8 + -1;
        fielddesc_setfloatarg((_fielddesc *)(object + 0xc),iVar8,argv);
        argv = argv + 1;
      }
      if (iVar4 == 0) {
        *(undefined2 *)(object + 0x11) = 1;
        *(undefined4 *)(object + 0x12) = 0x3f800000;
        object[0x13] = (t_pd)0x0;
        object[0x14] = (t_pd)0x0;
        *(undefined4 *)(object + 0x15) = 0;
        iVar8 = 0;
      }
      else {
        iVar8 = iVar4 + -1;
        fielddesc_setfloatarg((_fielddesc *)(object + 0x11),iVar4,argv);
        argv = argv + 1;
      }
      if (iVar8 == 0) {
        *(undefined2 *)(object + 0x16) = 1;
        *(undefined4 *)(object + 0x17) = 0x3f800000;
        object[0x18] = (t_pd)0x0;
        object[0x19] = (t_pd)0x0;
        *(undefined4 *)(object + 0x1a) = 0;
        iVar4 = 0;
      }
      else {
        iVar4 = iVar8 + -1;
        fielddesc_setfloatarg((_fielddesc *)(object + 0x16),iVar8,argv);
        argv = argv + 1;
      }
      if (iVar4 == 0) {
        *(undefined2 *)(object + 0x1b) = 1;
        *(undefined4 *)(object + 0x1c) = 0x3f800000;
        object[0x1d] = (t_pd)0x0;
        object[0x1e] = (t_pd)0x0;
        *(undefined4 *)(object + 0x1f) = 0;
        iVar8 = 0;
      }
      else {
        iVar8 = iVar4 + -1;
        fielddesc_setfloatarg((_fielddesc *)(object + 0x1b),iVar4,argv);
        argv = argv + 1;
      }
      if (iVar8 == 0) {
        *(undefined2 *)(object + 0x20) = 1;
        *(float *)(object + 0x21) = (float)local_9c;
        object[0x22] = (t_pd)0x0;
        object[0x23] = (t_pd)0x0;
        *(undefined4 *)(object + 0x24) = 0;
      }
      else {
        fielddesc_setfloatarg((_fielddesc *)(object + 0x20),iVar8,argv);
      }
      return object;
    }
  } while( true );
}

Assistant:

static void *plot_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_plot *x = (t_plot *)pd_new(plot_class);
    int defstyle = PLOTSTYLE_POLY;
    x->x_canvas = canvas_getcurrent();

    fielddesc_setfloat_var(&x->x_xpoints, gensym("x"));
    fielddesc_setfloat_var(&x->x_ypoints, gensym("y"));
    fielddesc_setfloat_var(&x->x_wpoints, gensym("w"));

    fielddesc_setfloat_const(&x->x_vis, 1);
    fielddesc_setfloat_const(&x->x_scalarvis, 1);
    fielddesc_setfloat_const(&x->x_edit, 1);
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "curve") ||
            !strcmp(firstarg->s_name, "-c"))
        {
            defstyle = PLOTSTYLE_BEZ;
            argc--, argv++;
        }
        else if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-vs") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_scalarvis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-x") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_xpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-y") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_ypoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-w") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_wpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-e") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_edit, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (*firstarg->s_name == '-')
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                firstarg->s_name);
            argc--; argv++;
        }
        else break;
    }
    if (argc) fielddesc_setarrayarg(&x->x_data, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_data, 1);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xinc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xinc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_style, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_style, defstyle);
    return (x);
}